

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_tzZones> *this)

{
  Holder<(anonymous_namespace)::Q_QGS_tzZones> *in_RDI;
  char newValue;
  
  pointer(in_RDI);
  newValue = (char)((ulong)in_RDI >> 0x38);
  anon_unknown.dwarf_10b2b6d::Q_QGS_tzZones::innerFunction((void *)0x752d16);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)&this->storage,newValue);
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }